

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

MemTxResult
subpage_read(uc_struct_conflict15 *uc,void *opaque,hwaddr addr,uint64_t *data,uint len,
            MemTxAttrs attrs)

{
  MemTxResult MVar1;
  ulong in_RAX;
  uint64_t uVar2;
  uint8_t buf [8];
  ulong local_18;
  
  local_18 = in_RAX;
  MVar1 = flatview_read(uc,*(FlatView **)((long)opaque + 0xa0),addr + *(long *)((long)opaque + 0xa8)
                        ,attrs,&local_18,(ulong)len);
  if (MVar1 == 0) {
    uVar2 = 0;
    switch(len) {
    case 1:
      uVar2 = local_18 & 0xff;
      break;
    case 2:
      uVar2 = local_18 & 0xffff;
      break;
    case 4:
      uVar2 = local_18 & 0xffffffff;
      break;
    case 8:
      uVar2 = local_18;
    }
    *data = uVar2;
  }
  return MVar1;
}

Assistant:

static MemTxResult subpage_read(struct uc_struct *uc, void *opaque, hwaddr addr, uint64_t *data,
                                unsigned len, MemTxAttrs attrs)
{
    subpage_t *subpage = opaque;
    uint8_t buf[8];
    MemTxResult res;

#if defined(DEBUG_SUBPAGE)
    printf("%s: subpage %p len %u addr " TARGET_FMT_plx "\n", __func__,
           subpage, len, addr);
#endif
    res = flatview_read(uc, subpage->fv, addr + subpage->base, attrs, buf, len);
    if (res) {
        return res;
    }
    *data = ldn_p(buf, len);
    return MEMTX_OK;
}